

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::df_store(Forth *this)

{
  uint pointer;
  double x;
  
  requireDStackDepth(this,1,"DF!");
  requireFStackDepth(this,1,"DF!");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  x = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell64(this,pointer,&x);
  return;
}

Assistant:

void df_store() {
			REQUIRE_DSTACK_DEPTH(1, "DF!");
			REQUIRE_FSTACK_DEPTH(1, "DF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "DF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell64(aaddr, x);
		}